

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pluginlist.cpp
# Opt level: O2

bool __thiscall ON_PlugInRef::Write(ON_PlugInRef *this,ON_BinaryArchive *file)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,1,2);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::WriteUuid(file,&this->m_plugin_id);
    if (((((bVar1) && (bVar1 = ON_BinaryArchive::WriteInt(file,this->m_plugin_type), bVar1)) &&
         (bVar1 = ON_BinaryArchive::WriteString(file,&this->m_plugin_name), bVar1)) &&
        (((bVar1 = ON_BinaryArchive::WriteString(file,&this->m_plugin_version), bVar1 &&
          (bVar1 = ON_BinaryArchive::WriteString(file,&this->m_plugin_filename), bVar1)) &&
         ((bVar1 = ON_BinaryArchive::WriteString(file,&this->m_developer_organization), bVar1 &&
          ((bVar1 = ON_BinaryArchive::WriteString(file,&this->m_developer_address), bVar1 &&
           (bVar1 = ON_BinaryArchive::WriteString(file,&this->m_developer_country), bVar1)))))))) &&
       ((bVar1 = ON_BinaryArchive::WriteString(file,&this->m_developer_phone), bVar1 &&
        (((((bVar1 = ON_BinaryArchive::WriteString(file,&this->m_developer_email), bVar1 &&
            (bVar1 = ON_BinaryArchive::WriteString(file,&this->m_developer_website), bVar1)) &&
           (bVar1 = ON_BinaryArchive::WriteString(file,&this->m_developer_updateurl), bVar1)) &&
          ((bVar1 = ON_BinaryArchive::WriteString(file,&this->m_developer_fax), bVar1 &&
           (bVar1 = ON_BinaryArchive::WriteInt(file,this->m_plugin_platform), bVar1)))) &&
         (bVar1 = ON_BinaryArchive::WriteInt(file,this->m_plugin_sdk_version), bVar1)))))) {
      bVar1 = ON_BinaryArchive::WriteInt(file,this->m_plugin_sdk_service_release);
    }
    else {
      bVar1 = false;
    }
    bVar2 = ON_BinaryArchive::EndWrite3dmChunk(file);
    return (bool)(bVar2 & bVar1);
  }
  return false;
}

Assistant:

bool ON_PlugInRef::Write( ON_BinaryArchive& file ) const
{
  bool rc = file.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,2);
  if (rc)
  {
    //version 1.0 fields
    if (rc) rc = file.WriteUuid(m_plugin_id);
    if (rc) rc = file.WriteInt(m_plugin_type);
    if (rc) rc = file.WriteString(m_plugin_name);
    if (rc) rc = file.WriteString(m_plugin_version);
    if (rc) rc = file.WriteString(m_plugin_filename);

    // version 1.1 fields 
    if (rc) rc = file.WriteString(m_developer_organization);
    if (rc) rc = file.WriteString(m_developer_address);
    if (rc) rc = file.WriteString(m_developer_country);
    if (rc) rc = file.WriteString(m_developer_phone);
    if (rc) rc = file.WriteString(m_developer_email);
    if (rc) rc = file.WriteString(m_developer_website);
    if (rc) rc = file.WriteString(m_developer_updateurl);
    if (rc) rc = file.WriteString(m_developer_fax);

    // version 1.2 fields
    if (rc) rc = file.WriteInt(m_plugin_platform);
    if (rc) rc = file.WriteInt(m_plugin_sdk_version);
    if (rc) rc = file.WriteInt(m_plugin_sdk_service_release);

    if( !file.EndWrite3dmChunk() )
      rc = false;
  }
  return rc;
}